

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_duplower(char *s)

{
  int iVar1;
  char *pcVar2;
  char *local_20;
  char *q;
  char *p;
  char *s_local;
  
  pcVar2 = strdup(s);
  for (local_20 = pcVar2; *local_20 != '\0'; local_20 = local_20 + 1) {
    iVar1 = tolower((int)*local_20);
    *local_20 = (char)iVar1;
  }
  return pcVar2;
}

Assistant:

char *stb_duplower(char *s)
{
   char *p = strdup(s), *q = p;
   while (*q) {
      *q = tolower(*q);
      ++q;
   }
   return p;
}